

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQPOMDP.cpp
# Opt level: O1

void __thiscall
FactoredQLastTimeStepOrQPOMDP::FactoredQLastTimeStepOrQPOMDP
          (FactoredQLastTimeStepOrQPOMDP *this,
          shared_ptr<const_PlanningUnitFactoredDecPOMDPDiscrete> *puf)

{
  int *piVar1;
  sp_counted_base *psVar2;
  QPOMDP *this_00;
  shared_ptr<const_PlanningUnitDecPOMDPDiscrete> local_38;
  
  *(undefined8 *)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       0x5a3eb8;
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5a3fb0;
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (&this->super_FactoredQLastTimeStepOrElse,&PTR_construction_vtable_136__005a3618,puf);
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5a3448;
  *(undefined8 *)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       0x5a3590;
  this_00 = (QPOMDP *)operator_new(0x60);
  psVar2 = (puf->pn).pi_;
  local_38.px = &puf->px->super_PlanningUnitDecPOMDPDiscrete;
  local_38.pn.pi_ = (puf->pn).pi_;
  if (psVar2 != (sp_counted_base *)0x0) {
    LOCK();
    piVar1 = &psVar2->use_count_;
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  QPOMDP::QPOMDP(this_00,&local_38);
  this->_m_QPOMDP = this_00;
  boost::detail::shared_count::~shared_count(&local_38.pn);
  return;
}

Assistant:

FactoredQLastTimeStepOrQPOMDP::
FactoredQLastTimeStepOrQPOMDP(const boost::shared_ptr<const PlanningUnitFactoredDecPOMDPDiscrete> &puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QPOMDP=new QPOMDP(puf);
}